

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_6d54c::DirectoryTreeStructureSignatureTask::inputsAvailable
          (DirectoryTreeStructureSignatureTask *this,TaskInterface ti)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first;
  pointer pSVar1;
  void *pvVar2;
  FileInfo *pFVar3;
  SubpathInfo *info;
  pointer arg;
  hash_code code;
  hash_combine_recursive_helper helper;
  BuildValue value;
  hash_code local_140;
  hash_code local_138;
  TaskInterface local_130;
  undefined1 local_120 [16];
  undefined1 local_110 [80];
  char *local_c0;
  uint64_t uStack_b8;
  BuildValue local_a0;
  
  local_130.ctx = ti.ctx;
  local_130.impl = ti.impl;
  first._M_current = (this->path)._M_dataplus._M_p;
  local_140 = llvm::hashing::detail::
              hash_combine_range_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                        (first,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                )(first._M_current + (this->path)._M_string_length));
  local_120._0_8_ =
       (this->directoryValue).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_120._8_8_ =
       (long)(this->directoryValue).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish - local_120._0_8_;
  local_110._0_8_ = 0;
  llbuild::buildsystem::BuildValue::BuildValue(&local_a0,(BinaryDecoder *)local_120);
  if (local_a0.kind == DirectoryContents) {
    pFVar3 = llbuild::buildsystem::BuildValue::getOutputInfo(&local_a0);
    llvm::hashing::detail::hash_combine_recursive_helper::hash_combine_recursive_helper
              ((hash_combine_recursive_helper *)local_120);
    local_140 = llvm::hashing::detail::hash_combine_recursive_helper::
                combine<llvm::hash_code,unsigned_long>
                          ((hash_combine_recursive_helper *)local_120,0,(char *)local_120,
                           (char *)&(((anon_union_80_2_ecfed234_for_valueData *)local_110)->
                                    asOutputInfo).checksum,&local_140,&pFVar3->mode);
  }
  else {
    local_138 = llvm::hashing::detail::
                hash_combine_range_impl<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                          ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            )(this->directoryValue).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,
                           (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                            )(this->directoryValue).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish);
    llvm::hashing::detail::hash_combine_recursive_helper::hash_combine_recursive_helper
              ((hash_combine_recursive_helper *)local_120);
    local_140 = llvm::hashing::detail::hash_combine_recursive_helper::
                combine<llvm::hash_code,llvm::hash_code>
                          ((hash_combine_recursive_helper *)local_120,0,(char *)local_120,
                           (char *)&(((anon_union_80_2_ecfed234_for_valueData *)local_110)->
                                    asOutputInfo).checksum,&local_140,&local_138);
  }
  llbuild::buildsystem::BuildValue::~BuildValue(&local_a0);
  arg = (this->childResults).
        super__Vector_base<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo>_>
        ._M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (this->childResults).
           super__Vector_base<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo,_std::allocator<(anonymous_namespace)::DirectoryTreeStructureSignatureTask::SubpathInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (arg != pSVar1) {
    do {
      llvm::hashing::detail::hash_combine_recursive_helper::hash_combine_recursive_helper
                ((hash_combine_recursive_helper *)local_120);
      local_120._0_8_ = local_140.value;
      local_140 = llvm::hashing::detail::hash_combine_recursive_helper::
                  combine<std::__cxx11::string>
                            ((hash_combine_recursive_helper *)local_120,0,local_120 + 8,
                             (char *)&(((anon_union_80_2_ecfed234_for_valueData *)local_110)->
                                      asOutputInfo).checksum,&arg->filename);
      local_120._0_8_ =
           (arg->value).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_120._8_8_ =
           (long)(arg->value).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish - local_120._0_8_;
      local_110._0_8_ = 0;
      llbuild::buildsystem::BuildValue::BuildValue(&local_a0,(BinaryDecoder *)local_120);
      if (local_a0.kind == ExistingInput) {
        pFVar3 = llbuild::buildsystem::BuildValue::getOutputInfo(&local_a0);
        llvm::hashing::detail::hash_combine_recursive_helper::hash_combine_recursive_helper
                  ((hash_combine_recursive_helper *)local_120);
        local_140 = llvm::hashing::detail::hash_combine_recursive_helper::
                    combine<llvm::hash_code,unsigned_long>
                              ((hash_combine_recursive_helper *)local_120,0,(char *)local_120,
                               (char *)&(((anon_union_80_2_ecfed234_for_valueData *)local_110)->
                                        asOutputInfo).checksum,&local_140,&pFVar3->mode);
      }
      else {
        local_138 = llvm::hashing::detail::
                    hash_combine_range_impl<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                              ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                )(arg->value).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_start,
                               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                )(arg->value).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish);
        llvm::hashing::detail::hash_combine_recursive_helper::hash_combine_recursive_helper
                  ((hash_combine_recursive_helper *)local_120);
        local_140 = llvm::hashing::detail::hash_combine_recursive_helper::
                    combine<llvm::hash_code,llvm::hash_code>
                              ((hash_combine_recursive_helper *)local_120,0,(char *)local_120,
                               (char *)&(((anon_union_80_2_ecfed234_for_valueData *)local_110)->
                                        asOutputInfo).checksum,&local_140,&local_138);
      }
      if ((arg->directoryStructureSignatureValue).Storage.hasVal == true) {
        local_138 = llvm::hashing::detail::
                    hash_combine_range_impl<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                              ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                )*(uchar **)
                                  (arg->directoryStructureSignatureValue).Storage.storage.
                                  super_AlignedCharArray<8UL,_24UL>.buffer,
                               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                )*(uchar **)
                                  ((arg->directoryStructureSignatureValue).Storage.storage.
                                   super_AlignedCharArray<8UL,_24UL>.buffer + 8));
        llvm::hashing::detail::hash_combine_recursive_helper::hash_combine_recursive_helper
                  ((hash_combine_recursive_helper *)local_120);
        local_140 = llvm::hashing::detail::hash_combine_recursive_helper::
                    combine<llvm::hash_code,llvm::hash_code>
                              ((hash_combine_recursive_helper *)local_120,0,(char *)local_120,
                               (char *)&(((anon_union_80_2_ecfed234_for_valueData *)local_110)->
                                        asOutputInfo).checksum,&local_140,&local_138);
      }
      else {
        local_138.value = 0xc183979c3e98722e;
        llvm::hashing::detail::hash_combine_recursive_helper::hash_combine_recursive_helper
                  ((hash_combine_recursive_helper *)local_120);
        local_140 = llvm::hashing::detail::hash_combine_recursive_helper::
                    combine<llvm::hash_code,unsigned_long>
                              ((hash_combine_recursive_helper *)local_120,0,(char *)local_120,
                               (char *)&(((anon_union_80_2_ecfed234_for_valueData *)local_110)->
                                        asOutputInfo).checksum,&local_140,&local_138.value);
      }
      llbuild::buildsystem::BuildValue::~BuildValue(&local_a0);
      arg = arg + 1;
    } while (arg != pSVar1);
  }
  local_120._0_8_ = (char *)0x6;
  local_120._8_8_ = local_140.value;
  local_110._0_8_ = 0;
  local_110._8_8_ = 0;
  local_110._16_8_ = 0;
  local_110._24_8_ = 0;
  local_110._32_8_ = 0;
  local_110._40_8_ = 0;
  local_110._48_8_ = 0;
  local_110._56_8_ = 0;
  local_110._64_8_ = 0;
  local_110._72_8_ = 0;
  local_c0 = (char *)0x0;
  uStack_b8 = 0;
  llbuild::buildsystem::BuildValue::toData((ValueType *)&local_a0,(BuildValue *)local_120);
  llbuild::core::TaskInterface::complete(&local_130,(ValueType *)&local_a0,false);
  pvVar2 = (void *)CONCAT44(local_a0.numOutputInfos,local_a0.kind);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)local_a0.valueData.asOutputInfos - (long)pvVar2);
  }
  llbuild::buildsystem::BuildValue::~BuildValue((BuildValue *)local_120);
  return;
}

Assistant:

virtual void inputsAvailable(TaskInterface ti) override {
    // Compute the signature across all of the inputs.
    using llvm::hash_combine;
    llvm::hash_code code = hash_value(path);

    // Only merge the structure information on the directory itself.
    {
      // We need to merge mode information about the directory itself, in case
      // it changes type.
      auto value = BuildValue::fromData(directoryValue);
      if (value.isDirectoryContents()) {
        code = hash_combine(code, value.getOutputInfo().mode);
      } else {
        code = hash_combine(
            code, hash_combine_range(directoryValue.begin(),
                                     directoryValue.end()));
      }
    }
    
    // For now, we represent this task as the aggregation of all the inputs.
    for (const auto& info: childResults) {
      // We only merge the "structural" information on a child; i.e. its
      // filename and type.
      code = hash_combine(code, info.filename);
      auto value = BuildValue::fromData(info.value);
      if (value.isExistingInput()) {
        code = hash_combine(code, value.getOutputInfo().mode);
      } else {
        // If this node has been modified to report a non-file value, just merge
        // the encoded representation.
        code = hash_combine(
            code, hash_combine_range(info.value.begin(), info.value.end()));
      }
      
      if (info.directoryStructureSignatureValue.hasValue()) {
        auto& data = info.directoryStructureSignatureValue.getValue();
        code = hash_combine(
            code, hash_combine_range(data.begin(), data.end()));
      } else {
        // Combine a random number to represent nil.
        code = hash_combine(code, 0XC183979C3E98722E);
      }
    }
    
    // Compute the signature.
    ti.complete(BuildValue::makeDirectoryTreeStructureSignature(
                  CommandSignature(uint64_t(code))).toData());
  }